

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerVariables.h
# Opt level: O2

void __thiscall
cmDebugger::cmDebuggerVariableEntry::~cmDebuggerVariableEntry(cmDebuggerVariableEntry *this)

{
  std::__cxx11::string::~string((string *)&this->Type);
  std::__cxx11::string::~string((string *)&this->Value);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmDebuggerVariableEntry()
    : cmDebuggerVariableEntry("", "", "")
  {
  }